

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_cmp(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  undefined8 in_RSI;
  uint i;
  uint temp_2;
  uint *Rb_2;
  uint *Ra_2;
  int16_t temp_1;
  int16_t *Rb_1;
  int16_t *Ra_1;
  char temp;
  char *Rb;
  char *Ra;
  uint8_t highb;
  uint8_t low;
  uint8_t high;
  
  bVar2 = (byte)code_ptr[registe_ptr->IP + 2] / 0x10;
  bVar1 = (byte)code_ptr[registe_ptr->IP + 2] % 0x10;
  if (code_ptr[registe_ptr->IP + 1] == '\0') {
    bVar3 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (bVar1 == 0) {
      set_flag((char)*register_list[bVar2] - (char)*register_list[bVar3]);
    }
    else if (bVar1 == 1) {
      set_flag((short)*register_list[bVar2] - (short)*register_list[bVar3]);
    }
    else {
      if (bVar1 != 2) {
        puVar4 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,in_RSI,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar4 = 0xf6;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      set_flag(*register_list[bVar2] - *register_list[bVar3]);
    }
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x01') {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    set_flag(*register_list[bVar2] - (int)code_ptr[registe_ptr->IP + 3]);
  }
  return 1;
}

Assistant:

int do_cmp() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == '\x00') {//寄存器比较
			uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
			if (low == 0) {
				char*Ra = (char *)register_list[high];
				char*Rb = (char*)register_list[highb];
				char temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 1)
			{
				int16_t*Ra = (int16_t *)register_list[high];
				int16_t*Rb = (int16_t *)register_list[highb];
				int16_t temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 2)
			{
				unsigned*Ra = (unsigned *)register_list[high];
				unsigned*Rb = (unsigned*)register_list[highb];
				unsigned temp = *Ra - *Rb;
				set_flag(temp);
			}
			else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == '\x01') {//立即数比较
		unsigned i = code_ptr[registe_ptr->IP + 3];
		set_flag(*register_list[high] - i);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}